

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_intersection_cardinality(run_container_t *src_1,run_container_t *src_2)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int local_50;
  int local_48;
  int32_t earliestend;
  int32_t lateststart;
  int32_t xend;
  int32_t xstart;
  int32_t end;
  int32_t start;
  int32_t xrlepos;
  int32_t rlepos;
  int answer;
  _Bool if2;
  _Bool if1;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var2 = run_container_is_full(src_1);
  _Var3 = run_container_is_full(src_2);
  if ((_Var2) || (_Var3)) {
    if (_Var2) {
      iVar4 = run_container_cardinality(src_2);
      return iVar4;
    }
    if (_Var3) {
      iVar4 = run_container_cardinality(src_1);
      return iVar4;
    }
  }
  xrlepos = 0;
  start = 0;
  end = 0;
  xstart = (int32_t)src_1->runs->value;
  xend = xstart + (uint)src_1->runs->length + 1;
  lateststart = (int32_t)src_2->runs->value;
  earliestend = lateststart + (uint)src_2->runs->length + 1;
  while( true ) {
    bVar1 = false;
    if (start < src_1->n_runs) {
      bVar1 = end < src_2->n_runs;
    }
    if (!bVar1) break;
    if ((uint)lateststart < (uint)xend) {
      if ((uint)xstart < (uint)earliestend) {
        if ((uint)lateststart < (uint)xstart) {
          local_50 = xstart;
        }
        else {
          local_50 = lateststart;
        }
        if (xend == earliestend) {
          local_48 = xend;
          start = start + 1;
          end = end + 1;
          if (start < src_1->n_runs) {
            xstart = (int32_t)src_1->runs[start].value;
            xend = xstart + (uint)src_1->runs[start].length + 1;
          }
          if (end < src_2->n_runs) {
            lateststart = (int32_t)src_2->runs[end].value;
            earliestend = lateststart + (uint)src_2->runs[end].length + 1;
          }
        }
        else if ((uint)xend < (uint)earliestend) {
          local_48 = xend;
          start = start + 1;
          if (start < src_1->n_runs) {
            xstart = (int32_t)src_1->runs[start].value;
            xend = xstart + (uint)src_1->runs[start].length + 1;
          }
        }
        else {
          local_48 = earliestend;
          end = end + 1;
          if (end < src_2->n_runs) {
            lateststart = (int32_t)src_2->runs[end].value;
            earliestend = lateststart + (uint)src_2->runs[end].length + 1;
          }
        }
        xrlepos = (local_48 - local_50) + xrlepos;
      }
      else {
        end = end + 1;
        if (end < src_2->n_runs) {
          lateststart = (int32_t)src_2->runs[end].value;
          earliestend = lateststart + (uint)src_2->runs[end].length + 1;
        }
      }
    }
    else {
      start = start + 1;
      if (start < src_1->n_runs) {
        xstart = (int32_t)src_1->runs[start].value;
        xend = xstart + (uint)src_1->runs[start].length + 1;
      }
    }
  }
  return xrlepos;
}

Assistant:

int run_container_intersection_cardinality(const run_container_t *src_1,
                                           const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return run_container_cardinality(src_2);
        }
        if (if2) {
            return run_container_cardinality(src_1);
        }
    }
    int answer = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            answer += earliestend - lateststart;
        }
    }
    return answer;
}